

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Segment::MoveCuesBeforeClusters(Segment *this)

{
  uint32_t uVar1;
  int32_t i_1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  int32_t i;
  int index;
  uint uVar5;
  long lVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint64_t local_38;
  
  uVar2 = Cues::Size(&this->cues_);
  uVar7 = 0;
  for (lVar6 = 0; uVar3 = (ulong)(this->cues_).cue_entries_size_, lVar6 < (long)uVar3;
      lVar6 = lVar6 + 1) {
    uVar4 = CuePoint::Size((this->cues_).cue_entries_[lVar6]);
    uVar7 = uVar7 + uVar4;
  }
  local_38 = uVar7;
  for (index = 0; index < (int)uVar3; index = index + 1) {
    MoveCuesBeforeClustersHelper(this,uVar2,index,&local_38);
    uVar3 = (ulong)(uint)(this->cues_).cue_entries_size_;
  }
  uVar5 = 0;
  uVar8 = 0;
  for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
    uVar1 = (this->seek_head_).seek_entry_id_[uVar3];
    if (uVar1 == 0x1f43b675) {
      uVar5 = (uint)uVar3;
    }
    if (uVar1 == 0x1c53bb6b) {
      uVar8 = uVar3 & 0xffffffff;
    }
  }
  if (uVar5 < 5) {
    uVar2 = (this->seek_head_).seek_entry_pos_[uVar5];
  }
  else {
    uVar2 = 0xffffffffffffffff;
  }
  if ((uint)uVar8 < 5) {
    (this->seek_head_).seek_entry_id_[uVar8] = 0x1c53bb6b;
    (this->seek_head_).seek_entry_pos_[uVar8] = uVar2;
  }
  uVar2 = Cues::Size(&this->cues_);
  if ((uint)uVar8 < 5) {
    uVar7 = (this->seek_head_).seek_entry_pos_[uVar8];
  }
  else {
    uVar7 = 0xffffffffffffffff;
  }
  if (uVar5 < 5) {
    (this->seek_head_).seek_entry_id_[uVar5] = 0x1f43b675;
    (this->seek_head_).seek_entry_pos_[uVar5] = uVar7 + uVar2;
  }
  return;
}

Assistant:

void Segment::MoveCuesBeforeClusters() {
  const uint64_t current_cue_size = cues_.Size();
  uint64_t cue_size = 0;
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    cue_size += cues_.GetCueByIndex(i)->Size();
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    MoveCuesBeforeClustersHelper(current_cue_size, i, &cue_size);

  // Adjust the Seek Entry to reflect the change in position
  // of Cluster and Cues
  int32_t cluster_index = 0;
  int32_t cues_index = 0;
  for (int32_t i = 0; i < SeekHead::kSeekEntryCount; ++i) {
    if (seek_head_.GetId(i) == libwebm::kMkvCluster)
      cluster_index = i;
    if (seek_head_.GetId(i) == libwebm::kMkvCues)
      cues_index = i;
  }
  seek_head_.SetSeekEntry(cues_index, libwebm::kMkvCues,
                          seek_head_.GetPosition(cluster_index));
  seek_head_.SetSeekEntry(cluster_index, libwebm::kMkvCluster,
                          cues_.Size() + seek_head_.GetPosition(cues_index));
}